

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O3

void readNumArrHelper<std::vector<long_double,std::allocator<long_double>>,long_double>
               (IniProcessing *self,char *key,
               vector<long_double,_std::allocator<long_double>_> *dest,
               vector<long_double,_std::allocator<long_double>_> *defVal)

{
  iterator iVar1;
  bool ok;
  bool local_29;
  value_type_conflict9 local_28;
  
  local_29 = false;
  iVar1 = IniProcessing_readHelper_abi_cxx11_(self,key,&local_29);
  if (local_29 != false) {
    local_28._0_10_ = (longdouble)0;
    StrToNumVectorHelper<std::vector<long_double,std::allocator<long_double>>>
              ((string *)
               ((long)iVar1.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                      ._M_cur + 0x28),dest,&local_28);
    return;
  }
  std::vector<long_double,_std::allocator<long_double>_>::operator=(dest,defVal);
  return;
}

Assistant:

void readNumArrHelper(IniProcessing *self, const char *key, TList &dest, const TList &defVal)
{
    bool ok = false;
    IniProcessing::params::IniKeys::iterator e = IniProcessing_readHelper(self, key, ok);

    if(!ok)
    {
        dest = defVal;
        return;
    }

    StrToNumVectorHelper(e->second, dest, static_cast<T>(0));
}